

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

bool __thiscall
mkvmuxer::MasteringMetadata::SetChromaticity
          (MasteringMetadata *this,PrimaryChromaticity *r,PrimaryChromaticity *g,
          PrimaryChromaticity *b,PrimaryChromaticity *white_point)

{
  _Head_base<0UL,_mkvmuxer::PrimaryChromaticity_*,_false> _Var1;
  _Head_base<0UL,_mkvmuxer::PrimaryChromaticity_*,_false> _Var2;
  _Head_base<0UL,_mkvmuxer::PrimaryChromaticity_*,_false> _Var3;
  bool bVar4;
  _Head_base<0UL,_mkvmuxer::PrimaryChromaticity_*,_false> _Var5;
  PrimaryChromaticityPtr wp_ptr;
  PrimaryChromaticityPtr b_ptr;
  PrimaryChromaticityPtr g_ptr;
  PrimaryChromaticityPtr r_ptr;
  _Head_base<0UL,_mkvmuxer::PrimaryChromaticity_*,_false> local_40;
  _Head_base<0UL,_mkvmuxer::PrimaryChromaticity_*,_false> local_38;
  _Head_base<0UL,_mkvmuxer::PrimaryChromaticity_*,_false> local_30;
  _Head_base<0UL,_mkvmuxer::PrimaryChromaticity_*,_false> local_28;
  
  local_28._M_head_impl = (PrimaryChromaticity *)0x0;
  if ((r != (PrimaryChromaticity *)0x0) &&
     (bVar4 = anon_unknown_12::CopyChromaticity(r,(PrimaryChromaticityPtr *)&local_28), !bVar4)) {
    bVar4 = false;
    goto LAB_0014eae8;
  }
  local_30._M_head_impl = (PrimaryChromaticity *)0x0;
  if ((g == (PrimaryChromaticity *)0x0) ||
     (bVar4 = anon_unknown_12::CopyChromaticity(g,(PrimaryChromaticityPtr *)&local_30), bVar4)) {
    local_38._M_head_impl = (PrimaryChromaticity *)0x0;
    if ((b == (PrimaryChromaticity *)0x0) ||
       (bVar4 = anon_unknown_12::CopyChromaticity(b,(PrimaryChromaticityPtr *)&local_38), bVar4)) {
      local_40._M_head_impl = (PrimaryChromaticity *)0x0;
      if (white_point == (PrimaryChromaticity *)0x0) {
        _Var5._M_head_impl = (PrimaryChromaticity *)0x0;
LAB_0014ea8d:
        _Var3._M_head_impl = local_28._M_head_impl;
        _Var2._M_head_impl = local_30._M_head_impl;
        _Var1._M_head_impl = local_38._M_head_impl;
        local_28._M_head_impl = (PrimaryChromaticity *)0x0;
        this->r_ = _Var3._M_head_impl;
        local_30._M_head_impl = (PrimaryChromaticity *)0x0;
        this->g_ = _Var2._M_head_impl;
        local_38._M_head_impl = (PrimaryChromaticity *)0x0;
        this->b_ = _Var1._M_head_impl;
        local_40._M_head_impl = (PrimaryChromaticity *)0x0;
        this->white_point_ = _Var5._M_head_impl;
        bVar4 = true;
      }
      else {
        bVar4 = anon_unknown_12::CopyChromaticity(white_point,(PrimaryChromaticityPtr *)&local_40);
        _Var5._M_head_impl = local_40._M_head_impl;
        if (bVar4) goto LAB_0014ea8d;
        bVar4 = false;
      }
      std::
      unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
      ::~unique_ptr((unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
                     *)&local_40);
    }
    else {
      bVar4 = false;
    }
    std::
    unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>::
    ~unique_ptr((unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
                 *)&local_38);
  }
  else {
    bVar4 = false;
  }
  std::
  unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>::
  ~unique_ptr((unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
               *)&local_30);
LAB_0014eae8:
  std::
  unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>::
  ~unique_ptr((unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
               *)&local_28);
  return bVar4;
}

Assistant:

bool MasteringMetadata::SetChromaticity(
    const PrimaryChromaticity* r, const PrimaryChromaticity* g,
    const PrimaryChromaticity* b, const PrimaryChromaticity* white_point) {
  PrimaryChromaticityPtr r_ptr(nullptr);
  if (r) {
    if (!CopyChromaticity(r, &r_ptr))
      return false;
  }
  PrimaryChromaticityPtr g_ptr(nullptr);
  if (g) {
    if (!CopyChromaticity(g, &g_ptr))
      return false;
  }
  PrimaryChromaticityPtr b_ptr(nullptr);
  if (b) {
    if (!CopyChromaticity(b, &b_ptr))
      return false;
  }
  PrimaryChromaticityPtr wp_ptr(nullptr);
  if (white_point) {
    if (!CopyChromaticity(white_point, &wp_ptr))
      return false;
  }

  r_ = r_ptr.release();
  g_ = g_ptr.release();
  b_ = b_ptr.release();
  white_point_ = wp_ptr.release();
  return true;
}